

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenAtomicLoad(BinaryenModuleRef module,uint32_t bytes,uint32_t offset,BinaryenType type,
                  BinaryenExpressionRef ptr,char *memoryName)

{
  Load *pLVar1;
  Address offset_00;
  Builder local_48;
  IString local_40;
  
  offset_00.addr._4_4_ = 0;
  offset_00.addr._0_4_ = offset;
  local_48.wasm = module;
  local_40.str = (string_view)getMemoryName(module,memoryName);
  pLVar1 = wasm::Builder::makeLoad
                     (&local_48,bytes,false,offset_00,bytes,ptr,(Type)type,(Name)local_40.str);
  pLVar1->isAtomic = true;
  return (BinaryenExpressionRef)pLVar1;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicLoad(BinaryenModuleRef module,
                                         uint32_t bytes,
                                         uint32_t offset,
                                         BinaryenType type,
                                         BinaryenExpressionRef ptr,
                                         const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeAtomicLoad(bytes,
                      offset,
                      (Expression*)ptr,
                      Type(type),
                      getMemoryName(module, memoryName)));
}